

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O3

void NULLC::TraceLeave(double ts,uint eventPos,uint labelPos)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  double dVar7;
  
  lVar4 = traceContext;
  if (*(int *)(traceContext + 0x270) == *(int *)(traceContext + 0x274)) {
    TraceDump();
  }
  uVar5 = NULLCTime::clockMicro();
  uVar1 = *(uint *)(lVar4 + 0x270);
  lVar3 = *(long *)(lVar4 + 0x278);
  if (eventPos < uVar1) {
    uVar2 = *(uint *)(lVar3 + 4 + (ulong)eventPos * 8);
    dVar7 = (double)uVar2;
    if ((dVar7 == ts) && (!NAN(dVar7) && !NAN(ts))) {
      if (*(uint *)(lVar4 + 0x260) < labelPos) {
        __assert_fail("context.labels.count >= labelPos",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                      ,0xfc,"void NULLC::TraceLeave(double, unsigned int, unsigned int)");
      }
      if ((*(byte *)(lVar3 + (ulong)eventPos * 8) & 1) == 0) {
        __assert_fail("enterEvent.isEnter",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                      ,0xfd,"void NULLC::TraceLeave(double, unsigned int, unsigned int)");
      }
      if (uVar5 - uVar2 < 0x32) {
        *(uint *)(lVar4 + 0x270) = eventPos;
        *(uint *)(lVar4 + 0x260) = labelPos;
        iVar6 = *(int *)(lVar4 + 0x244);
        if (iVar6 == 0) {
          __assert_fail("context.depth != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                        ,0x104,"void NULLC::TraceLeave(double, unsigned int, unsigned int)");
        }
        goto LAB_0010f088;
      }
    }
  }
  *(uint *)(lVar4 + 0x270) = uVar1 + 1;
  *(undefined4 *)(lVar3 + (ulong)uVar1 * 8) = 0;
  *(uint *)(lVar3 + 4 + (ulong)uVar1 * 8) = uVar5;
  iVar6 = *(int *)(lVar4 + 0x244);
  if (iVar6 == 0) {
    __assert_fail("context.depth != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                  ,0x112,"void NULLC::TraceLeave(double, unsigned int, unsigned int)");
  }
LAB_0010f088:
  *(int *)(lVar4 + 0x244) = iVar6 + -1;
  return;
}

Assistant:

inline void TraceLeave(double ts, unsigned eventPos, unsigned labelPos)
	{
		TraceContext &context = *traceContext;

		if(context.events.count == context.events.max)
			TraceDump();

		unsigned currTs = NULLCTime::clockMicro();

		if(context.events.count > eventPos && context.events.data[eventPos].ts == ts)
		{
			TraceEvent &enterEvent = context.events.data[eventPos];

			assert(context.labels.count >= labelPos);
			assert(enterEvent.isEnter);

			if(currTs - enterEvent.ts < 50)
			{
				context.events.count = eventPos;
				context.labels.count = labelPos;

				assert(context.depth != 0);
				context.depth--;

				return;
			}
		}

		TraceEvent &traceEvent = context.events.data[context.events.count++];

		traceEvent.isEnter = false;
		traceEvent.isLabel = false;
		traceEvent.token = 0;
		traceEvent.ts = currTs;

		assert(context.depth != 0);
		context.depth--;
	}